

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

UINT8 device_start_ym2413_emu(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  undefined8 *puVar1;
  uint clk;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  UINT8 UVar7;
  EOPLL *pEVar8;
  byte bVar9;
  long lVar10;
  UINT32 rate;
  
  clk = cfg->clock;
  if ((cfg->srMode == '\x01') ||
     ((rate = clk / 0x48, cfg->srMode == '\x02' && (clk / 0x48 < cfg->smplRate)))) {
    rate = cfg->smplRate;
  }
  pEVar8 = EOPLL_new(clk,rate);
  if (pEVar8 == (EOPLL *)0x0) {
    UVar7 = 0xff;
  }
  else {
    bVar9 = cfg->flags & 1;
    pEVar8->chip_type = bVar9;
    if (bVar9 == 0) {
      lVar10 = 0;
      do {
        *(undefined4 *)((long)pEVar8->patch + lVar10 + 0x30U) =
             *(undefined4 *)((long)&default_patch[0][0].WS + lVar10);
        uVar2 = *(undefined8 *)((long)&default_patch[0][0].TL + lVar10);
        uVar3 = *(undefined8 *)((long)&default_patch[0][0].EG + lVar10);
        uVar4 = *(undefined8 *)((long)&default_patch[0][0].AR + lVar10);
        uVar5 = *(undefined8 *)((long)&default_patch[0][0].SL + lVar10);
        uVar6 = *(undefined8 *)((long)&default_patch[0][0].AM + lVar10);
        puVar1 = (undefined8 *)((long)pEVar8->patch + lVar10 + 0x20U);
        *puVar1 = *(undefined8 *)((long)&default_patch[0][0].KR + lVar10);
        puVar1[1] = uVar6;
        puVar1 = (undefined8 *)((long)pEVar8->patch + lVar10 + 0x10U);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        puVar1 = (undefined8 *)((long)pEVar8->patch + lVar10);
        *puVar1 = uVar2;
        puVar1[1] = uVar3;
        lVar10 = lVar10 + 0x34;
      } while (lVar10 != 0x7b8);
    }
    else {
      lVar10 = 0;
      do {
        *(undefined4 *)((long)pEVar8->patch + lVar10 + 0x30U) =
             *(undefined4 *)((long)&default_patch[1][0].WS + lVar10);
        uVar2 = *(undefined8 *)((long)&default_patch[1][0].TL + lVar10);
        uVar3 = *(undefined8 *)((long)&default_patch[1][0].EG + lVar10);
        uVar4 = *(undefined8 *)((long)&default_patch[1][0].AR + lVar10);
        uVar5 = *(undefined8 *)((long)&default_patch[1][0].SL + lVar10);
        uVar6 = *(undefined8 *)((long)&default_patch[1][0].AM + lVar10);
        puVar1 = (undefined8 *)((long)pEVar8->patch + lVar10 + 0x20U);
        *puVar1 = *(undefined8 *)((long)&default_patch[1][0].KR + lVar10);
        puVar1[1] = uVar6;
        puVar1 = (undefined8 *)((long)pEVar8->patch + lVar10 + 0x10U);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        puVar1 = (undefined8 *)((long)pEVar8->patch + lVar10);
        *puVar1 = uVar2;
        puVar1[1] = uVar3;
        lVar10 = lVar10 + 0x34;
      } while (lVar10 != 0x7b8);
    }
    pEVar8->_devData = (DEV_DATA)pEVar8;
    retDevInf->dataPtr = &pEVar8->_devData;
    retDevInf->sampleRate = rate;
    retDevInf->devDef = &devDef_YM2413_Emu;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar7 = '\0';
  }
  return UVar7;
}

Assistant:

static UINT8 device_start_ym2413_emu(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	EOPLL* chip;
	uint32_t rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = EOPLL_new(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	EOPLL_setChipType(chip, cfg->flags & 0x01);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2413_Emu);
	return 0x00;
}